

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O0

void testDeepTiledBasic(string *tempDir)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  exception *e;
  int pass;
  int numThreads;
  int local_1c;
  undefined4 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Testing the DeepTiledInput/OutputFile for basic use");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  uVar1 = IlmThread_2_5::ThreadPool::numThreads();
  iVar2 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar2);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    anon_unknown.dwarf_da1a9::readWriteTestWithAbsoluateCoordinates
              (in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
               (string *)CONCAT44(in_stack_ffffffffffffffec,uVar1));
    anon_unknown.dwarf_da1a9::readWriteTestWithAbsoluateCoordinates
              (in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
               (string *)CONCAT44(in_stack_ffffffffffffffec,uVar1));
    anon_unknown.dwarf_da1a9::readWriteTestWithAbsoluateCoordinates
              (in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
               (string *)CONCAT44(in_stack_ffffffffffffffec,uVar1));
  }
  iVar2 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar2);
  poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void testDeepTiledBasic (const std::string & tempDir)
{
    try
    {
        cout << "Testing the DeepTiledInput/OutputFile for basic use" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(2);

        for(int pass = 0 ; pass < 4 ; pass++)
        {
           readWriteTestWithAbsoluateCoordinates ( 1, 2, tempDir);
           readWriteTestWithAbsoluateCoordinates ( 3, 2, tempDir);
           readWriteTestWithAbsoluateCoordinates (10, 2, tempDir);
        }
        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}